

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O0

vec3 __thiscall ltc::sample(ltc *this,vec3 *view_dir,vec2 *random_parameters)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  col_type cVar6;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 aVar7;
  undefined8 local_88;
  float local_80;
  mat3 local_74;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_50;
  undefined1 local_44 [8];
  vec3 original_sample;
  float theta;
  float phi;
  vec2 *random_parameters_local;
  vec3 *view_dir_local;
  ltc *this_local;
  
  dVar1 = std::sqrt((double)(ulong)(uint)(random_parameters->field_0).field_0.x);
  dVar1 = std::acos(dVar1);
  original_sample.field_0.field_0.z = (float)SUB84(dVar1,0);
  original_sample.field_0.field_0.y = (random_parameters->field_0).field_0.y * 6.2831855;
  dVar1 = std::sin((double)((ulong)dVar1 & 0xffffffff));
  dVar2 = std::cos((double)(ulong)(uint)original_sample.field_0.field_0.y);
  dVar3 = std::sin((double)(ulong)(uint)original_sample.field_0.field_0.z);
  dVar4 = std::sin((double)(ulong)(uint)original_sample.field_0.field_0.y);
  dVar5 = std::cos((double)(ulong)(uint)original_sample.field_0.field_0.z);
  glm::vec<3,_float,_(glm::precision)0>::vec
            ((vec<3,_float,_(glm::precision)0> *)local_44,SUB84(dVar1,0) * SUB84(dVar2,0),
             SUB84(dVar3,0) * SUB84(dVar4,0),SUB84(dVar5,0));
  get_framed_ltc_matrix(&local_74,this);
  cVar6 = glm::operator*(&local_74,(vec<3,_float,_(glm::precision)0> *)local_44);
  local_80 = cVar6.field_0._8_4_;
  local_50.field_0.z = local_80;
  local_88 = cVar6.field_0._0_8_;
  local_50._0_8_ = local_88;
  aVar7.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
        )glm::normalize<3,float,(glm::precision)0,glm::vec>
                   ((vec<3,_float,_(glm::precision)0> *)&local_50.field_0);
  return (anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3)
         (anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3)aVar7.field_0;
}

Assistant:

glm::vec3 ltc::sample(const glm::vec3 &view_dir, const glm::vec2 &random_parameters) const
{
  const float phi = std::acos(std::sqrt(random_parameters.x));
  const float theta = 2.0f * pi * random_parameters.y;

  const glm::vec3 original_sample{
    std::sin(phi) * std::cos(theta),
    std::sin(phi) * std::sin(theta),
    std::cos(phi)
  };

  return glm::normalize(get_framed_ltc_matrix() * original_sample);
}